

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void hexdump(void *start,size_t size)

{
  ulong local_28;
  size_t i;
  GString *s;
  size_t size_local;
  void *start_local;
  
  i = g_string_new("");
  local_28 = 0;
  while( true ) {
    if ((local_28 & 0xf) == 0) {
      if (*(long *)(i + 8) != 0) {
        g_log("rifiuti2",0x80,"%s",*(undefined8 *)i);
        i = g_string_assign(i,"");
      }
      g_string_append_printf(i,"%04zX    ",local_28);
    }
    if (size <= local_28) break;
    g_string_append_printf(i,"%02X ",*(undefined1 *)((long)start + local_28));
    local_28 = local_28 + 1;
  }
  g_string_free(i,1);
  return;
}

Assistant:

void
hexdump    (void     *start,
            size_t    size)
{
    GString *s = g_string_new ("");
    size_t i = 0;
    while (true)
    {
        if (i % 16 == 0)
        {
            if (s->len > 0)
            {
                g_debug ("%s", s->str);
                s = g_string_assign (s, "");
            }
            g_string_append_printf (s, "%04zX    ", i);
        }
        if (i >= size)
            break;
        g_string_append_printf (s, "%02" PRIX8 " ", *(uint8_t *) (start+i));
        i++;
    }

    g_string_free (s, TRUE);
}